

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
QPDFObjectHandle::arrayOrStreamToStreamArray
          (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__return_storage_ptr__,
          QPDFObjectHandle *this,string *description,string *all_description)

{
  element_type *peVar1;
  pointer pcVar2;
  pointer pQVar3;
  uint uVar4;
  __index_type _Var5;
  bool bVar6;
  uint uVar7;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar8;
  undefined8 *puVar9;
  QPDFObjGen *pQVar10;
  long *plVar11;
  ulong uVar12;
  QPDFObjGen QVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **pp_Var14;
  QPDF *pQVar15;
  uint __val;
  pointer pQVar16;
  uint __len;
  string __str;
  Array array;
  QPDFObjectHandle item;
  string local_1b0;
  string local_190;
  ulong *local_170;
  long local_168;
  ulong local_160 [2];
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  uint local_10c;
  Array local_108;
  string *local_f0;
  string *local_e8;
  QPDFObjectHandle local_e0;
  string local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_b0;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  _Alloc_hider _Stack_98;
  
  local_f0 = description;
  local_e8 = all_description;
  std::__cxx11::string::_M_assign((string *)all_description);
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    _Var5 = '\0';
  }
  else {
    _Var5 = (peVar1->value).
            super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            .
            super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            ._M_index;
    if (_Var5 == '\x0f') {
      pvVar8 = std::
               get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                         (&peVar1->value);
    }
    else {
      if (_Var5 != '\r') goto LAB_001c5e32;
      pvVar8 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                *)QPDF::resolve(peVar1->qpdf,*(QPDFObjGen *)&(peVar1->og).obj);
    }
    _Var5 = *(__index_type *)
             ((long)&(((pvVar8->obj).super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->value).
                     super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     .
                     super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
             + 0x30);
  }
LAB_001c5e32:
  if (_Var5 == '\b') {
    local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_108.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_108.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
  }
  else {
    local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  local_108.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                    )0x0;
  if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    bVar6 = isStream(this);
    if (bVar6) {
      std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
      emplace_back<QPDFObjectHandle&>
                ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)__return_storage_ptr__
                 ,this);
    }
    else {
      bVar6 = isNull(this);
      if (!bVar6) {
        peVar1 = (this->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 == (element_type *)0x0) {
          pQVar15 = (QPDF *)0x0;
        }
        else {
          pQVar15 = peVar1->qpdf;
        }
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_190,
                   " object is supposed to be a stream or an array of streams but is neither","");
        QPDFExc::QPDFExc((QPDFExc *)&local_b0,qpdf_e_damaged_pdf,&local_1b0,local_f0,0,&local_190);
        warn(pQVar15,(QPDFExc *)&local_b0);
        QPDFExc::~QPDFExc((QPDFExc *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  else {
    local_10c = ::qpdf::Array::size(&local_108);
    if (0 < (int)local_10c) {
      __val = 0;
      do {
        ::qpdf::Array::at((pair<bool,_QPDFObjectHandle> *)&local_b0,&local_108,__val);
        local_e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_a8;
        local_e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Stack_a0;
        bVar6 = isStream(&local_e0);
        if (bVar6) {
          std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
          emplace_back<QPDFObjectHandle&>
                    ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)
                     __return_storage_ptr__,&local_e0);
        }
        else {
          if (local_e0.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            pQVar15 = (QPDF *)0x0;
          }
          else {
            pQVar15 = (local_e0.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qpdf;
          }
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"");
          local_170 = local_160;
          pcVar2 = (local_f0->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,pcVar2,pcVar2 + local_f0->_M_string_length);
          std::__cxx11::string::append((char *)&local_170);
          __len = 1;
          if (9 < __val) {
            uVar12 = (ulong)__val;
            uVar4 = 4;
            do {
              __len = uVar4;
              uVar7 = (uint)uVar12;
              if (uVar7 < 100) {
                __len = __len - 2;
                goto LAB_001c5fc0;
              }
              if (uVar7 < 1000) {
                __len = __len - 1;
                goto LAB_001c5fc0;
              }
              if (uVar7 < 10000) goto LAB_001c5fc0;
              uVar12 = uVar12 / 10000;
              uVar4 = __len + 4;
            } while (99999 < uVar7);
            __len = __len + 1;
          }
LAB_001c5fc0:
          local_130 = local_120;
          std::__cxx11::string::_M_construct((ulong)&local_130,(char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_130,__len,__val);
          uVar12 = 0xf;
          if (local_170 != local_160) {
            uVar12 = local_160[0];
          }
          if (uVar12 < (ulong)(local_128 + local_168)) {
            uVar12 = 0xf;
            if (local_130 != local_120) {
              uVar12 = local_120[0];
            }
            if (uVar12 < (ulong)(local_128 + local_168)) goto LAB_001c604e;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_170)
            ;
          }
          else {
LAB_001c604e:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_130);
          }
          local_150 = &local_140;
          plVar11 = puVar9 + 2;
          if ((long *)*puVar9 == plVar11) {
            local_140 = *plVar11;
            uStack_138 = puVar9[3];
          }
          else {
            local_140 = *plVar11;
            local_150 = (long *)*puVar9;
          }
          local_148 = puVar9[1];
          *puVar9 = plVar11;
          puVar9[1] = 0;
          *(undefined1 *)plVar11 = 0;
          pQVar10 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_150);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          QVar13 = (QPDFObjGen)(pQVar10 + 2);
          if (*pQVar10 == QVar13) {
            local_190.field_2._M_allocated_capacity = *(undefined8 *)QVar13;
            local_190.field_2._8_4_ = pQVar10[3].obj;
            local_190.field_2._12_4_ = pQVar10[3].gen;
          }
          else {
            local_190.field_2._M_allocated_capacity = *(undefined8 *)QVar13;
            local_190._M_dataplus._M_p = (pointer)*pQVar10;
          }
          local_190._M_string_length = *(size_type *)(pQVar10 + 1);
          *pQVar10 = QVar13;
          pQVar10[1].obj = 0;
          pQVar10[1].gen = 0;
          *(undefined1 *)&pQVar10[2].obj = 0;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"ignoring non-stream in an array of streams","");
          QPDFExc::QPDFExc((QPDFExc *)&local_b0,qpdf_e_damaged_pdf,&local_1b0,&local_190,0,&local_d0
                          );
          warn(pQVar15,(QPDFExc *)&local_b0);
          QPDFExc::~QPDFExc((QPDFExc *)&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_150 != &local_140) {
            operator_delete(local_150,local_140 + 1);
          }
          if (local_130 != local_120) {
            operator_delete(local_130,local_120[0] + 1);
          }
          if (local_170 != local_160) {
            operator_delete(local_170,local_160[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_e0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e0.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        __val = __val + 1;
      } while (__val != local_10c);
    }
  }
  std::
  unique_ptr<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ::~unique_ptr(&local_108.sp_elements);
  if (local_108.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  pQVar16 = (__return_storage_ptr__->
            super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pQVar3 = (__return_storage_ptr__->
           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pQVar16 != pQVar3) {
    bVar6 = true;
    do {
      if (bVar6) {
        bVar6 = false;
      }
      else {
        std::__cxx11::string::append((char *)local_e8);
      }
      peVar1 = (pQVar16->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        local_190._M_dataplus._M_p._0_4_ = 0;
        local_190._M_dataplus._M_p._4_4_ = 0;
      }
      else {
        local_190._M_dataplus._M_p = *(pointer *)&peVar1->og;
      }
      QPDFObjGen::unparse_abi_cxx11_(&local_1b0,(QPDFObjGen *)&local_190,' ');
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x2854cf);
      pp_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(plVar11 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar11 == pp_Var14) {
        p_Stack_a0 = *pp_Var14;
        _Stack_98._M_p = (pointer)plVar11[3];
        local_b0 = &p_Stack_a0;
      }
      else {
        p_Stack_a0 = *pp_Var14;
        local_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*plVar11;
      }
      local_a8 = (element_type *)plVar11[1];
      *plVar11 = (long)pp_Var14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_e8,(ulong)local_b0);
      if (local_b0 != &p_Stack_a0) {
        operator_delete(local_b0,(ulong)((long)&p_Stack_a0->_vptr__Sp_counted_base + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      pQVar16 = pQVar16 + 1;
    } while (pQVar16 != pQVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFObjectHandle>
QPDFObjectHandle::arrayOrStreamToStreamArray(
    std::string const& description, std::string& all_description)
{
    all_description = description;
    std::vector<QPDFObjectHandle> result;
    if (auto array = as_array(strict)) {
        int n_items = array.size();
        for (int i = 0; i < n_items; ++i) {
            QPDFObjectHandle item = array.at(i).second;
            if (item.isStream()) {
                result.emplace_back(item);
            } else {
                QTC::TC("qpdf", "QPDFObjectHandle non-stream in stream array");
                warn(
                    item.getOwningQPDF(),
                    QPDFExc(
                        qpdf_e_damaged_pdf,
                        "",
                        description + ": item index " + std::to_string(i) + " (from 0)",
                        0,
                        "ignoring non-stream in an array of streams"));
            }
        }
    } else if (isStream()) {
        result.emplace_back(*this);
    } else if (!isNull()) {
        warn(
            getOwningQPDF(),
            QPDFExc(
                qpdf_e_damaged_pdf,
                "",
                description,
                0,
                " object is supposed to be a stream or an array of streams but is neither"));
    }

    bool first = true;
    for (auto const& item: result) {
        if (first) {
            first = false;
        } else {
            all_description += ",";
        }
        all_description += " stream " + item.getObjGen().unparse(' ');
    }

    return result;
}